

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  ostream *poVar3;
  SocketAcceptor *this;
  long *plVar4;
  char *pcVar5;
  int extraout_EDX;
  SocketAcceptor *__stat_loc;
  string file;
  SessionSettings settings;
  SessionSettings local_258;
  Application application;
  FileStoreFactory storeFactory;
  ScreenLogFactory logFactory;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," FILE.");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,argv[1],(allocator<char> *)&storeFactory);
    FIX::SessionSettings::SessionSettings(&settings,(string *)&file,false);
    Application::Application(&application.super_Application);
    FIX::FileStoreFactory::FileStoreFactory(&storeFactory,&settings);
    FIX::SessionSettings::SessionSettings(&local_258,&settings);
    FIX::ScreenLogFactory::ScreenLogFactory(&logFactory,&local_258);
    FIX::SessionSettings::~SessionSettings(&local_258);
    this = (SocketAcceptor *)operator_new(0x1d0);
    FIX::SocketAcceptor::SocketAcceptor
              (this,&application.super_Application,(MessageStoreFactory *)&storeFactory,&settings,
               (LogFactory *)&logFactory);
    __stat_loc = this;
    FIX::Acceptor::start();
    _Var2 = wait(__stat_loc);
    (**(code **)(*(long *)this + 8))(this);
    FIX::ScreenLogFactory::~ScreenLogFactory(&logFactory);
    FIX::FileStoreFactory::~FileStoreFactory(&storeFactory);
    FIX::SessionSettings::~SessionSettings(&settings);
    if (extraout_EDX != 1) {
      std::__cxx11::string::~string((string *)&file);
      _Unwind_Resume(_Var2);
    }
    plVar4 = (long *)__cxa_begin_catch(_Var2);
    pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    __cxa_end_catch();
    std::__cxx11::string::~string((string *)&file);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];
#ifdef HAVE_SSL
  std::string isSSL;
  if (argc > 2) {
    isSSL.assign(argv[2]);
  }
#endif

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);

    std::unique_ptr<FIX::Acceptor> acceptor;
#ifdef HAVE_SSL
    if (isSSL.compare("SSL") == 0) {
      acceptor = std::unique_ptr<FIX::Acceptor>(
          new FIX::ThreadedSSLSocketAcceptor(application, storeFactory, settings, logFactory));
    } else if (isSSL.compare("SSL-ST") == 0) {
      acceptor
          = std::unique_ptr<FIX::Acceptor>(new FIX::SSLSocketAcceptor(application, storeFactory, settings, logFactory));
    } else
#endif
      acceptor
          = std::unique_ptr<FIX::Acceptor>(new FIX::SocketAcceptor(application, storeFactory, settings, logFactory));

    acceptor->start();
    wait();
    acceptor->stop();

    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}